

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O3

string * Imf_3_4::insertViewName
                   (string *__return_storage_ptr__,string *channel,StringVector *multiView,int i)

{
  pointer pcVar1;
  pointer pbVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  long *plVar6;
  char c;
  long lVar7;
  ulong uVar8;
  string *newName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  StringVector s;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  long *local_90 [2];
  long local_80 [2];
  StringVector local_70;
  StringVector *local_58;
  string local_50;
  
  pcVar1 = (channel->_M_dataplus)._M_p;
  local_58 = multiView;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + channel->_M_string_length);
  anon_unknown_5::parseString(&local_70,&local_50,c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  lVar4 = (long)local_70.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_70.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar4 == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((i == 0) && (lVar4 == 0x20)) {
      pcVar1 = (channel->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + channel->_M_string_length);
    }
    else {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      uVar5 = lVar4 >> 5;
      lVar4 = 8;
      uVar8 = 0;
      local_98 = &__return_storage_ptr__->field_2;
      do {
        if (uVar8 < uVar5 - 1) {
          lVar7 = *(long *)((long)local_70.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start + lVar4 + -8);
          local_b8 = &local_a8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b8,lVar7,
                     *(long *)((long)&((local_70.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar4) + lVar7);
          std::__cxx11::string::append((char *)&local_b8);
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
          lVar7 = local_a8;
          plVar3 = local_b8;
          if (local_b8 != &local_a8) {
LAB_00192d7d:
            operator_delete(plVar3,lVar7 + 1);
          }
        }
        else {
          pbVar2 = (local_58->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          local_90[0] = local_80;
          pcVar1 = pbVar2[i]._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_90,pcVar1,pcVar1 + pbVar2[i]._M_string_length);
          std::__cxx11::string::append((char *)local_90);
          plVar3 = (long *)std::__cxx11::string::_M_append
                                     ((char *)local_90,
                                      *(ulong *)((long)local_70.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                                lVar4 + -8));
          plVar6 = plVar3 + 2;
          if ((long *)*plVar3 == plVar6) {
            local_a8 = *plVar6;
            lStack_a0 = plVar3[3];
            local_b8 = &local_a8;
          }
          else {
            local_a8 = *plVar6;
            local_b8 = (long *)*plVar3;
          }
          local_b0 = plVar3[1];
          *plVar3 = (long)plVar6;
          plVar3[1] = 0;
          *(undefined1 *)(plVar3 + 2) = 0;
          std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_b8);
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,local_a8 + 1);
          }
          lVar7 = local_80[0];
          plVar3 = local_90[0];
          if (local_90[0] != local_80) goto LAB_00192d7d;
        }
        uVar8 = uVar8 + 1;
        uVar5 = (long)local_70.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_70.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar4 = lVar4 + 0x20;
      } while (uVar8 < uVar5);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_70);
  return __return_storage_ptr__;
}

Assistant:

string
insertViewName (const string& channel, const StringVector& multiView, int i)
{
    //
    // Insert multiView[i] into the channel name if appropriate.
    //

    StringVector s = parseString (channel, '.');

    if (s.size () == 0) return ""; // nothing in, nothing out

    if (s.size () == 1 && i == 0)
    {
        //
        // Channel in the default view, with no periods in its name.
        // Do not insert view name.
        //

        return channel;
    }

    //
    // View name becomes penultimate section of new channel name.
    //

    string newName;

    for (size_t j = 0; j < s.size (); ++j)
    {
        if (j < s.size () - 1)
            newName += s[j] + ".";
        else
            newName += multiView[i] + "." + s[j];
    }

    return newName;
}